

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O0

void __thiscall FS::Focuser::doSStatus(Focuser *this,CommandPacket cp)

{
  type sink;
  type sink_00;
  NetInterface *pNVar1;
  char *string;
  DebugInterface *log;
  Focuser *this_local;
  CommandPacket cp_local;
  
  sink = std::unique_ptr<DebugInterface,_std::default_delete<DebugInterface>_>::operator*
                   (&this->debugLog);
  ::operator<<(sink,"Processing sstatus request\n");
  sink_00 = std::unique_ptr<NetInterface,_std::default_delete<NetInterface>_>::operator*(&this->net)
  ;
  pNVar1 = ::operator<<(sink_00,"Synched: ");
  string = "NO";
  if ((this->isSynched & 1U) != 0) {
    string = "YES";
  }
  pNVar1 = ::operator<<(pNVar1,string);
  ::operator<<(pNVar1,"\n");
  return;
}

Assistant:

void Focuser::doSStatus( CommandParser::CommandPacket cp )
{
  (void) cp;
  DebugInterface& log = *debugLog;

  log << "Processing sstatus request\n";
  *net << "Synched: " << (isSynched ? "YES" : "NO" ) << "\n";
}